

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_string_utils.c
# Opt level: O3

int coda__pcre2_strncmp_8(PCRE2_SPTR8 str1,PCRE2_SPTR8 str2,size_t len)

{
  size_t sVar1;
  
  if (len != 0) {
    sVar1 = 0;
    do {
      if (str1[sVar1] != str2[sVar1]) {
        return (str2[sVar1] < str1[sVar1]) - 1 | 1;
      }
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
  }
  return 0;
}

Assistant:

int
PRIV(strncmp)(PCRE2_SPTR str1, PCRE2_SPTR str2, size_t len)
{
PCRE2_UCHAR c1, c2;
for (; len > 0; len--)
  {
  c1 = *str1++;
  c2 = *str2++;
  if (c1 != c2) return ((c1 > c2) << 1) - 1;
  }
return 0;
}